

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool __thiscall google::anon_unknown_1::FlagValue::Equal(FlagValue *this,FlagValue *x)

{
  double __n;
  bool bVar1;
  int iVar2;
  char in_CL;
  double *in_RDX;
  
  if ((char)x == in_CL) {
    switch((ulong)x & 0xff) {
    case 0:
      bVar1 = *(char *)&this->value_buffer_ == *(char *)in_RDX;
      break;
    case 1:
    case 2:
      bVar1 = *(int *)&this->value_buffer_ == *(int *)in_RDX;
      break;
    case 3:
    case 4:
      bVar1 = this->value_buffer_ == (void *)*in_RDX;
      break;
    case 5:
      bVar1 = (bool)(-(*in_RDX == (double)this->value_buffer_) & 1);
      break;
    case 6:
      __n = *(double *)&this->type_;
      if (__n == in_RDX[1]) {
        if (__n != 0.0) {
          iVar2 = bcmp(this->value_buffer_,(void *)*in_RDX,(size_t)__n);
          return iVar2 == 0;
        }
        return true;
      }
      goto LAB_0019296f;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x1b4,
                    "bool google::(anonymous namespace)::FlagValue::Equal(const FlagValue &) const")
      ;
    }
  }
  else {
LAB_0019296f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FlagValue::Equal(const FlagValue& x) const {
  if (type_ != x.type_)
    return false;
  switch (type_) {
    case FV_BOOL:   return VALUE_AS(bool) == OTHER_VALUE_AS(x, bool);
    case FV_INT32:  return VALUE_AS(int32) == OTHER_VALUE_AS(x, int32);
    case FV_UINT32: return VALUE_AS(uint32) == OTHER_VALUE_AS(x, uint32);
    case FV_INT64:  return VALUE_AS(int64) == OTHER_VALUE_AS(x, int64);
    case FV_UINT64: return VALUE_AS(uint64) == OTHER_VALUE_AS(x, uint64);
    case FV_DOUBLE: return VALUE_AS(double) == OTHER_VALUE_AS(x, double);
    case FV_STRING: return VALUE_AS(string) == OTHER_VALUE_AS(x, string);
    default: assert(false); return false;  // unknown type
  }
}